

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CInstIterNext(CInstIter *pIter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int local_20;
  int iEnd;
  int io;
  int ic;
  int ip;
  int rc;
  CInstIter *pIter_local;
  
  ic = 0;
  pIter->iStart = -1;
  pIter->iEnd = -1;
  _ip = pIter;
  while( true ) {
    bVar1 = false;
    if (ic == 0) {
      bVar1 = _ip->iInst < _ip->nInst;
    }
    if (!bVar1) break;
    ic = (*_ip->pApi->xInst)(_ip->pFts,_ip->iInst,&io,&iEnd,&local_20);
    if (ic == 0) {
      if (iEnd == _ip->iCol) {
        iVar2 = local_20 + -1;
        iVar3 = (*_ip->pApi->xPhraseSize)(_ip->pFts,io);
        iVar2 = iVar2 + iVar3;
        if (_ip->iStart < 0) {
          _ip->iStart = local_20;
          _ip->iEnd = iVar2;
        }
        else {
          if (_ip->iEnd < local_20) {
            return ic;
          }
          if (_ip->iEnd < iVar2) {
            _ip->iEnd = iVar2;
          }
        }
      }
      _ip->iInst = _ip->iInst + 1;
    }
  }
  return ic;
}

Assistant:

static int fts5CInstIterNext(CInstIter *pIter){
  int rc = SQLITE_OK;
  pIter->iStart = -1;
  pIter->iEnd = -1;

  while( rc==SQLITE_OK && pIter->iInst<pIter->nInst ){
    int ip; int ic; int io;
    rc = pIter->pApi->xInst(pIter->pFts, pIter->iInst, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      if( ic==pIter->iCol ){
        int iEnd = io - 1 + pIter->pApi->xPhraseSize(pIter->pFts, ip);
        if( pIter->iStart<0 ){
          pIter->iStart = io;
          pIter->iEnd = iEnd;
        }else if( io<=pIter->iEnd ){
          if( iEnd>pIter->iEnd ) pIter->iEnd = iEnd;
        }else{
          break;
        }
      }
      pIter->iInst++;
    }
  }

  return rc;
}